

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BplusTree.hpp
# Opt level: O1

pair<unsigned_int,_bool> __thiscall
sjtu::BplusTree<unsigned_long_long,_unsigned_int,_100,_std::less<unsigned_long_long>_>::find
          (BplusTree<unsigned_long_long,_unsigned_int,_100,_std::less<unsigned_long_long>_> *this,
          unsigned_long_long *key)

{
  long lVar1;
  uint uVar2;
  int iVar3;
  undefined4 extraout_var;
  pair<unsigned_int,_bool> pVar5;
  ulong uVar6;
  int in_ECX;
  ulong uVar7;
  ulong uVar8;
  int iVar9;
  bool bVar10;
  locType pos;
  long local_28;
  long lVar4;
  
  if (this->depth == 0) {
    pVar5.first = 0;
    pVar5.second = false;
    pVar5._5_3_ = 0;
    return pVar5;
  }
  lVar4 = this->root;
  if (0 < this->depth) {
    iVar9 = 0;
    local_28 = lVar4;
    do {
      iVar3 = (*(this->file->
                super_FileManager_Base<sjtu::BplusTree<unsigned_long_long,_unsigned_int,_100,_std::less<unsigned_long_long>_>::node>
                )._vptr_FileManager_Base[2])(this->file,&local_28);
      lVar4 = CONCAT44(extraout_var,iVar3);
      uVar2 = *(uint *)(lVar4 + 0x640);
      uVar6 = (ulong)uVar2;
      bVar10 = 0 < (int)uVar2;
      if ((int)uVar2 < 1) {
        uVar7 = 0;
      }
      else {
        uVar7 = 0;
        if (*(ulong *)(lVar4 + 0x328) < *key) {
          uVar8 = 0;
          do {
            if (uVar6 - 1 == uVar8) {
              bVar10 = uVar8 + 1 < uVar6;
              uVar7 = uVar6;
              goto LAB_0010bd58;
            }
            uVar7 = uVar8 + 1;
            lVar1 = uVar8 * 8;
            uVar8 = uVar7;
          } while (*(ulong *)(lVar4 + 0x330 + lVar1) < *key);
          bVar10 = uVar7 < uVar6;
        }
      }
LAB_0010bd58:
      in_ECX = (int)uVar7;
      if (iVar9 < this->depth + -1) {
        uVar7 = uVar7 & 0xffffffff;
        if ((bVar10) && (*(ulong *)(lVar4 + 0x328 + uVar7 * 8) <= *key)) {
          local_28 = *(long *)(lVar4 + 8 + uVar7 * 8);
        }
        else {
          local_28 = *(long *)(lVar4 + uVar7 * 8);
        }
      }
      iVar9 = iVar9 + 1;
    } while (iVar9 < this->depth);
  }
  if ((in_ECX == *(int *)(lVar4 + 0x640)) || (*key < *(ulong *)(lVar4 + 0x328 + (long)in_ECX * 8)))
  {
    uVar6 = 0;
    uVar7 = 0;
  }
  else {
    uVar6 = (ulong)*(uint *)(lVar4 + (long)in_ECX * 4);
    uVar7 = 0x100000000;
  }
  return (pair<unsigned_int,_bool>)(uVar6 | uVar7);
}

Assistant:

std::pair<T, bool> find(const Key &key) {
            T ret;
            if (!depth)return std::make_pair(ret, 0);
            locType pos = root;
            node *x;
            int i, j;
            for (i = 0; i < depth; ++i) {
                x = file->read(pos);
                for (j = 0; j < x->sz && Compare()(x->keyvalue[j], key); ++j);
                if (i < depth - 1) {
                    if (j < x->sz && !Compare()(key, x->keyvalue[j]))pos = x->pointer[j + 1];
                    else pos = x->pointer[j];
                }
            }
            if (j == x->sz || Compare()(key, x->keyvalue[j]))
                return std::make_pair(ret, false);
            ret = x->val[j];
            return std::make_pair(ret, true);
        }